

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::compileAnnotation(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader source;
  Field field;
  Field field_00;
  Builder target;
  ImplicitParams implicitMethodParams;
  undefined1 auVar1 [40];
  StructSchema SVar2;
  ElementCount index;
  StringPtr name;
  Field srcField;
  Field dstField;
  undefined4 uStack_25c;
  StructReader local_258;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined6 uStack_210;
  undefined2 uStack_20a;
  undefined6 local_208;
  undefined2 uStack_202;
  undefined6 uStack_200;
  undefined1 uStack_1fa;
  undefined1 uStack_1f9;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  Schema local_1f0;
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_1e8;
  Schema local_1a8;
  uint uStack_1a0;
  undefined4 uStack_19c;
  SegmentReader *local_198;
  CapTableReader *pCStack_190;
  void *local_188;
  WirePointer *pWStack_180;
  StructDataBitCount local_178;
  StructPointerCount SStack_174;
  undefined2 uStack_172;
  int iStack_170;
  undefined4 uStack_16c;
  Builder local_168;
  Reader local_138;
  Field local_100;
  FieldList local_c0;
  StructBuilder local_88;
  StructReader local_60;
  
  if (decl._reader.pointerCount < 6) {
    aStack_1e8._16_4_ = 0x7fffffff;
    aStack_1e8.intValue = (int64_t)(SegmentReader *)0x0;
    aStack_1e8.textValue.super_StringPtr.content.size_ = (size_t)(SegmentReader *)0x0;
    local_1f0.raw = (RawBrandedSchema *)0x0;
  }
  else {
    aStack_1e8.anyPointerValue.reader.capTable = (CapTableReader *)(decl._reader.pointers + 5);
    aStack_1e8.anyPointerValue.reader.segment = (SegmentReader *)decl._reader.capTable;
    local_1f0.raw = (RawBrandedSchema *)decl._reader.segment;
    aStack_1e8._16_4_ = decl._reader.nestingLimit;
  }
  index = 0;
  capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_1f0,(word *)0x0);
  aStack_1e8.anyPointerValue.reader.capTable = (CapTableReader *)(builder._builder.pointers + 3);
  local_1f0.raw = (RawBrandedSchema *)builder._builder.segment;
  aStack_1e8.anyPointerValue.reader.segment = (SegmentReader *)builder._builder.capTable;
  capnp::_::PointerBuilder::initStruct(&local_88,(PointerBuilder *)&local_1f0,(StructSize)0x10003);
  local_228 = 0;
  uStack_220 = 0;
  local_218 = 0;
  uStack_210 = 0;
  uStack_20a = 0;
  local_208 = 0;
  uStack_202 = 0;
  uStack_200 = 0;
  uStack_1fa = 7;
  local_1f8 = 0x7fffffff;
  implicitMethodParams.params.reader._44_4_ = uStack_1f4;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = uStack_1f9;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  source._reader.capTable = local_60.capTable;
  source._reader.segment = local_60.segment;
  source._reader.data = local_60.data;
  source._reader.pointers = local_60.pointers;
  source._reader.dataSize = local_60.dataSize;
  source._reader.pointerCount = local_60.pointerCount;
  source._reader._38_2_ = local_60._38_2_;
  source._reader.nestingLimit = local_60.nestingLimit;
  source._reader._44_4_ = local_60._44_4_;
  target._builder.capTable = local_88.capTable;
  target._builder.segment = local_88.segment;
  target._builder.data = local_88.data;
  target._builder.pointers = local_88.pointers;
  target._builder.dataSize = local_88.dataSize;
  target._builder.pointerCount = local_88.pointerCount;
  target._builder._38_2_ = local_88._38_2_;
  auVar1 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar1._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar1._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar1._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar1._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar1._32_4_;
  implicitMethodParams.params.reader.step = auVar1._36_4_;
  compileType(this,source,target,implicitMethodParams);
  local_138.reader._32_8_ = decl._reader._32_8_;
  local_138.reader._40_8_ = decl._reader._40_8_;
  local_138.reader.data = decl._reader.data;
  local_138.reader.pointers = decl._reader.pointers;
  local_138.reader.segment = decl._reader.segment;
  local_138.reader.capTable = decl._reader.capTable;
  local_138.schema.super_Schema.raw = (Schema)((long)schemas::s_9cb9e86e3198037f + 0x48);
  local_168.builder.dataSize = builder._builder.dataSize;
  local_168.builder.pointerCount = builder._builder.pointerCount;
  local_168.builder._38_2_ = builder._builder._38_2_;
  local_168.builder.data = builder._builder.data;
  local_168.builder.pointers = builder._builder.pointers;
  local_168.builder.segment = builder._builder.segment;
  local_168.builder.capTable = builder._builder.capTable;
  local_168.schema.super_Schema.raw = (Schema)((long)schemas::s_ec1619d4400a0290 + 0x48);
  local_1f0.raw = (RawBrandedSchema *)(schemas::s_9cb9e86e3198037f + 0x48);
  StructSchema::getFields(&local_c0,(StructSchema *)&local_1f0);
  if (local_c0.list.reader.elementCount != 0) {
    do {
      SVar2.super_Schema.raw = (Schema)(Schema)local_c0.parent;
      capnp::_::ListReader::getStructElement(&local_258,&local_c0.list.reader,index);
      aStack_1e8.textValue.super_StringPtr.content.size_ = (size_t)local_258.pointers;
      aStack_1e8.intValue = (int64_t)local_258.capTable;
      local_1f0.raw = (RawBrandedSchema *)local_258.segment;
      aStack_1e8._16_4_ = local_258.nestingLimit;
      if (local_258.pointerCount == 0) {
        aStack_1e8.textValue.super_StringPtr.content.size_ = (size_t)(SegmentReader *)0x0;
        aStack_1e8.intValue = (int64_t)(SegmentReader *)0x0;
        local_1f0.raw = (RawBrandedSchema *)(SegmentBuilder *)0x0;
        aStack_1e8._16_4_ = 0x7fffffff;
      }
      name.content = (ArrayPtr<const_char>)
                     capnp::_::PointerReader::getBlob<capnp::Text>
                               ((PointerReader *)&local_1f0,(void *)0x0,0);
      if ((6 < name.content.size_ - 1) &&
         (*(int *)((long)name.content.ptr + 3) == 0x73746567 &&
          *(int *)name.content.ptr == 0x67726174)) {
        local_1f0 = local_168.schema.super_Schema.raw;
        StructSchema::getFieldByName(&local_100,(StructSchema *)&local_1f0,name);
        local_1a8 = local_100.parent.super_Schema.raw;
        uStack_1a0 = local_100.index;
        uStack_19c = local_100._12_4_;
        local_198 = local_100.proto._reader.segment;
        pCStack_190 = local_100.proto._reader.capTable;
        local_188 = local_100.proto._reader.data;
        pWStack_180 = local_100.proto._reader.pointers;
        local_178 = local_100.proto._reader.dataSize;
        SStack_174 = local_100.proto._reader.pointerCount;
        uStack_172 = local_100.proto._reader._38_2_;
        iStack_170 = local_100.proto._reader.nestingLimit;
        uStack_16c = local_100.proto._reader._44_4_;
        field._12_4_ = uStack_25c;
        field.index = index;
        field.proto._reader.pointerCount = local_258.pointerCount;
        field.proto._reader.dataSize = local_258.dataSize;
        field.proto._reader._38_2_ = local_258._38_2_;
        field.proto._reader._44_4_ = local_258._44_4_;
        field.proto._reader.nestingLimit = local_258.nestingLimit;
        field.parent.super_Schema.raw = SVar2.super_Schema.raw;
        field.proto._reader.segment = local_258.segment;
        field.proto._reader.capTable = local_258.capTable;
        field.proto._reader.data = local_258.data;
        field.proto._reader.pointers = local_258.pointers;
        DynamicStruct::Reader::get((Reader *)&local_1f0,&local_138,field);
        field_00.index = uStack_1a0;
        field_00._12_4_ = uStack_19c;
        field_00.parent.super_Schema.raw = (Schema)(Schema)local_1a8.raw;
        field_00.proto._reader.segment = local_198;
        field_00.proto._reader.capTable = pCStack_190;
        field_00.proto._reader.data = local_188;
        field_00.proto._reader.pointers = pWStack_180;
        field_00.proto._reader.dataSize = local_178;
        field_00.proto._reader.pointerCount = SStack_174;
        field_00.proto._reader._38_2_ = uStack_172;
        field_00.proto._reader.nestingLimit = iStack_170;
        field_00.proto._reader._44_4_ = uStack_16c;
        DynamicStruct::Builder::set(&local_168,field_00,(Reader *)&local_1f0);
        DynamicValue::Reader::~Reader((Reader *)&local_1f0);
      }
      index = index + 1;
    } while (local_c0.list.reader.elementCount != index);
  }
  return;
}

Assistant:

void NodeTranslator::compileAnnotation(Declaration::Annotation::Reader decl,
                                       schema::Node::Annotation::Builder builder) {
  compileType(decl.getType(), builder.initType(), ImplicitParams::none());

  // Dynamically copy over the values of all of the "targets" members.
  DynamicStruct::Reader src = decl;
  DynamicStruct::Builder dst = builder;
  for (auto srcField: src.getSchema().getFields()) {
    kj::StringPtr fieldName = srcField.getProto().getName();
    if (fieldName.startsWith("targets")) {
      auto dstField = dst.getSchema().getFieldByName(fieldName);
      dst.set(dstField, src.get(srcField));
    }
  }
}